

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O0

void * line_tilde_new(void)

{
  t_object *owner;
  t_symbol *s;
  t_line *x;
  
  owner = (t_object *)pd_new(line_tilde_class);
  s = gensym("signal");
  outlet_new(owner,s);
  floatinlet_new(owner,(t_float *)&owner[1].te_outlet);
  *(undefined4 *)((long)&owner[1].te_inlet + 4) = 0;
  *(undefined4 *)&owner[1].te_inlet = 0;
  *(undefined4 *)((long)&owner[1].te_outlet + 4) = 0;
  *(undefined4 *)&owner[1].te_outlet = 0;
  *(undefined4 *)&owner[1].te_g.g_pd = 0;
  *(undefined4 *)((long)&owner[1].te_g.g_pd + 4) = 0;
  return owner;
}

Assistant:

static void *line_tilde_new(void)
{
    t_line *x = (t_line *)pd_new(line_tilde_class);
    outlet_new(&x->x_obj, gensym("signal"));
    floatinlet_new(&x->x_obj, &x->x_inletvalue);
    x->x_ticksleft = x->x_retarget = 0;
    x->x_value = x->x_target = x->x_inletvalue = x->x_inletwas = 0;
    return (x);
}